

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::ClassSpecifierSyntax> *args_1;
  SyntaxNode *args_3;
  SyntaxNode *args_4;
  FunctionPrototypeSyntax *pFVar1;
  DeepCloneVisitor visitor;
  SyntaxNode *local_58;
  Token local_50;
  Token local_40;
  
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = deepClone<slang::syntax::ClassSpecifierSyntax>
                     ((SyntaxList<slang::syntax::ClassSpecifierSyntax> *)(__fn + 0x28),
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  args_3 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x70),(DeepCloneVisitor *)&local_58,
                      (BumpAllocator *)__child_stack);
  args_4 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x78),(DeepCloneVisitor *)&local_58,
                      (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x80) == (SyntaxNode *)0x0) {
    local_58 = (SyntaxNode *)0x0;
  }
  else {
    local_58 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x80),(DeepCloneVisitor *)&local_58,
                          (BumpAllocator *)__child_stack);
  }
  pFVar1 = BumpAllocator::
           emplace<slang::syntax::FunctionPrototypeSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ClassSpecifierSyntax>&,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::syntax::NameSyntax&,slang::syntax::FunctionPortListSyntax*>
                     ((BumpAllocator *)__child_stack,&local_40,args_1,&local_50,
                      (DataTypeSyntax *)args_3,(NameSyntax *)args_4,
                      (FunctionPortListSyntax **)&local_58);
  return (int)pFVar1;
}

Assistant:

static SyntaxNode* clone(const FunctionPrototypeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<FunctionPrototypeSyntax>(
        node.keyword.deepClone(alloc),
        *deepClone(node.specifiers, alloc),
        node.lifetime.deepClone(alloc),
        *deepClone<DataTypeSyntax>(*node.returnType, alloc),
        *deepClone<NameSyntax>(*node.name, alloc),
        node.portList ? deepClone(*node.portList, alloc) : nullptr
    );
}